

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_lib.cc
# Opt level: O2

void EnumerateGrids(size_t first_grid_idx,size_t count,void *index,void *table,
                   _func_void_char_ptr *callback)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong limit;
  size_t remaining;
  anon_class_24_3_8aa9199d skipping_callback;
  char pattern [82];
  size_t local_b8;
  ulong local_b0;
  _func_void_char_ptr *local_a8;
  ulong *local_a0;
  _func_void_char_ptr **local_98;
  undefined1 *local_90;
  char local_88 [88];
  
  lVar2 = (first_grid_idx >> 0x14) * 6;
  uVar3 = *(uint *)((long)index + lVar2);
  local_b0 = (ulong)((uint)first_grid_idx & 0xfffff) + (ulong)*(ushort *)((long)index + lVar2 + 4);
  while( true ) {
    uVar4 = (ulong)uVar3;
    uVar1 = *(ushort *)((long)table + uVar4 * 2);
    if (local_b0 < uVar1) break;
    uVar3 = uVar3 + 1;
    local_b0 = local_b0 - uVar1;
  }
  local_b8 = count;
  local_a8 = callback;
  while (local_b8 != 0) {
    limit = local_b8 + local_b0;
    if ((ulong)uVar1 <= local_b8 + local_b0) {
      limit = (ulong)uVar1;
    }
    GetPattern((int)uVar4,local_88);
    local_a0 = &local_b0;
    local_98 = &local_a8;
    local_90 = (undefined1 *)&local_b8;
    TdokuEnumerate(local_88,limit,EnumerateGrids::anon_class_1_0_00000001::__invoke,&local_a0);
    uVar4 = (ulong)((int)uVar4 + 1);
    uVar1 = *(ushort *)((long)table + uVar4 * 2);
  }
  return;
}

Assistant:

void EnumerateGrids(size_t first_grid_idx, size_t count,
                    const void *index, const void *table,
                    void (*callback)(const char *)) {
    size_t indexed_grid_idx = first_grid_idx & ~((1ull << 20u) - 1);
    uint32_t current_pattern_idx = *(uint32_t *)(((char *)index) + (first_grid_idx >> 20u)* 6);
    uint16_t indexed_grid_offset = *(uint16_t *)(((char *)index) + (first_grid_idx  >> 20u)* 6 + 4);

    size_t to_skip = indexed_grid_offset + (first_grid_idx  - indexed_grid_idx);
    uint16_t pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    while (to_skip >= pattern_count) {
        to_skip -= pattern_count;
        current_pattern_idx++;
        pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    }
    size_t remaining = count;
    while (remaining > 0) {
        size_t limit = to_skip + remaining;
        if (limit > pattern_count) limit = pattern_count;

        char pattern[82];
        GetPattern(current_pattern_idx, pattern);

        auto skipping_callback=[&](const char *grid){
            if (to_skip > 0) {
                to_skip--;
            } else {
                callback(grid);
                remaining--;
            }
        };
        // pass a thunk since we can't pass a capturing lambda as a function pointer
        TdokuEnumerate(pattern, limit, [](const char *grid, void *thunked_callback) {
            (*static_cast<decltype(skipping_callback)*>(thunked_callback))(grid);
        }, &skipping_callback);

        current_pattern_idx++;
        pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    }
}